

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O2

_Bool do_curse_effect(wchar_t i,object *obj)

{
  effect *effect;
  _Bool aware;
  uint32_t uVar1;
  object **ppoVar2;
  source sVar3;
  source origin;
  _Bool ident;
  
  ppoVar2 = &curses[i].obj;
  effect = (*ppoVar2)->effect;
  ident = false;
  aware = player_knows_curse(player,i);
  uVar1 = Rand_div(8);
  if ((*ppoVar2)->effect_msg != (char *)0x0) {
    msgt(0,"%s");
  }
  sVar3 = source_object(obj);
  origin.which = sVar3.which;
  origin._4_4_ = 0;
  origin.what = sVar3.what;
  effect_do(effect,origin,(object *)0x0,&ident,aware,uVar1 + (3 < (int)uVar1) + L'\x01',L'\0',L'\0',
            (command *)0x0);
  (*ppoVar2)->known->effect = (*ppoVar2)->effect;
  disturb(player);
  return (_Bool)(!aware & ident);
}

Assistant:

bool do_curse_effect(int i, struct object *obj)
{
	struct curse *curse = &curses[i];
	struct effect *effect = curse->obj->effect;
	bool ident = false;
	bool was_aware = player_knows_curse(player, i);
	int dir = randint1(8);

	if (dir > 4) {
		dir++;
	}
	if (curse->obj->effect_msg) {
		msgt(MSG_GENERIC, "%s", curse->obj->effect_msg);
	}
	effect_do(effect, source_object(obj), NULL, &ident, was_aware, dir, 0, 0, NULL);
	curse->obj->known->effect = curse->obj->effect;
	disturb(player);
	return !was_aware && ident;
}